

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O1

void call_from_thread(int *n_chr,int *m_chr,double *NM_chr,int *NI,double *eta_chr,double *Pj_chr,
                     string query_path,string reference_path,string chrom_size_path,int chr_id,
                     string id,int scale)

{
  string query_path_00;
  string reference_path_00;
  string chrom_size_path_00;
  string id_00;
  undefined1 *puVar1;
  undefined1 in_stack_ffffffffffffff58 [24];
  undefined1 *puVar2;
  int in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80 [16];
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar3 = &stack0xffffffffffffffa0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff90,*(long *)query_path._M_dataplus._M_p,
             *(long *)(query_path._M_dataplus._M_p + 8) + *(long *)query_path._M_dataplus._M_p);
  puVar2 = &stack0xffffffffffffff80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff70,*(long *)query_path._M_string_length,
             *(long *)(query_path._M_string_length + 8) + *(long *)query_path._M_string_length);
  puVar1 = &stack0xffffffffffffff60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff50,*(long *)query_path.field_2._M_allocated_capacity,
             *(long *)(query_path.field_2._M_allocated_capacity + 8) +
             *(long *)query_path.field_2._M_allocated_capacity);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)reference_path._M_dataplus._M_p,
             *(long *)(reference_path._M_dataplus._M_p + 8) +
             *(long *)reference_path._M_dataplus._M_p);
  query_path_00._M_string_length = (size_type)&stack0xffffffffffffff70;
  query_path_00._M_dataplus._M_p = &stack0xffffffffffffff90;
  query_path_00.field_2._M_allocated_capacity = (size_type)&stack0xffffffffffffff50;
  query_path_00.field_2._8_4_ = query_path.field_2._8_4_;
  query_path_00.field_2._12_4_ = 0;
  reference_path_00._M_string_length._0_4_ = (undefined4)reference_path._M_string_length;
  reference_path_00._M_dataplus._M_p = (pointer)local_50;
  reference_path_00._M_string_length._4_4_ = 0;
  reference_path_00.field_2._M_allocated_capacity = (size_type)n_chr;
  reference_path_00.field_2._8_8_ = puVar1;
  chrom_size_path_00.field_2._8_8_ = puVar2;
  chrom_size_path_00._0_24_ = in_stack_ffffffffffffff58;
  id_00.field_2._M_allocated_capacity = (size_type)puVar3;
  id_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff80._0_8_;
  id_00._M_string_length = in_stack_ffffffffffffff80._8_8_;
  id_00.field_2._8_8_ = in_stack_ffffffffffffff98;
  chrom(n_chr,m_chr,NM_chr,NI,eta_chr,Pj_chr,query_path_00,reference_path_00,chrom_size_path_00,
        in_stack_ffffffffffffff78,id_00,in_stack_ffffffffffffffa0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (puVar1 != &stack0xffffffffffffff60) {
    operator_delete(puVar1);
  }
  if (puVar2 != &stack0xffffffffffffff80) {
    operator_delete(puVar2);
  }
  if (puVar3 != &stack0xffffffffffffffa0) {
    operator_delete(puVar3);
  }
  return;
}

Assistant:

void call_from_thread(int* n_chr, int* m_chr, double* NM_chr, int* NI, double* eta_chr, double* Pj_chr, 
                      string query_path, string reference_path, string chrom_size_path, int chr_id,
                      string id, int scale)
{
    chrom(n_chr, m_chr, NM_chr, NI, eta_chr, Pj_chr, query_path, reference_path, chrom_size_path,
                      chr_id, id, scale);
}